

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qicohandler.cpp
# Opt level: O3

void __thiscall ICOReader::read8BitBMP(ICOReader *this,QImage *image)

{
  QIODevice *pQVar1;
  undefined8 uVar2;
  long lVar3;
  longlong lVar4;
  long lVar5;
  int iVar6;
  long in_FS_OFFSET;
  QImage local_60 [16];
  undefined8 local_50;
  undefined8 *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->iod != (QIODevice *)0x0) {
    iVar6 = (this->icoAttrib).h;
    lVar3 = QImage::bytesPerLine();
    do {
      if (iVar6 < 1) goto LAB_001046bf;
      iVar6 = iVar6 + -1;
      pQVar1 = this->iod;
      lVar4 = QImage::scanLine((int)image);
      lVar5 = QIODevice::read((char *)pQVar1,lVar4);
    } while (lVar5 == lVar3);
  }
  QImage::QImage(local_60);
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_48 = (undefined8 *)0xaaaaaaaaaaaaaaaa;
  uStack_40 = 0xaaaaaaaaaaaaaaaa;
  QPaintDevice::QPaintDevice((QPaintDevice *)&local_48);
  uVar2 = local_50;
  local_48 = &QImageIOPlugin::staticMetaObject;
  local_50 = 0;
  local_38 = *(undefined8 *)(image + 0x10);
  *(undefined8 *)(image + 0x10) = uVar2;
  QImage::~QImage((QImage *)&local_48);
  QImage::~QImage(local_60);
LAB_001046bf:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ICOReader::read8BitBMP(QImage & image)
{
    if (iod) {

        int h = icoAttrib.h;
        qsizetype bpl = image.bytesPerLine();

        while (--h >= 0) {
            if (iod->read((char *)image.scanLine(h), bpl) != bpl) {
                image = QImage();
                break;
            }
        }
    } else {
        image = QImage();
    }
}